

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msatOrderH.c
# Opt level: O0

int Msat_HeapCheck_rec(Msat_Order_t *p,int i)

{
  double *pdVar1;
  double dVar2;
  int iVar3;
  bool local_16;
  bool local_15;
  int i_local;
  Msat_Order_t *p_local;
  
  local_15 = true;
  if (i < p->vHeap->nSize) {
    if ((i >> 1 == 0) ||
       (dVar2 = p->pSat->pdActivity[p->vHeap->pArray[i]],
       pdVar1 = p->pSat->pdActivity + p->vHeap->pArray[i >> 1], local_16 = false,
       dVar2 < *pdVar1 || dVar2 == *pdVar1)) {
      iVar3 = Msat_HeapCheck_rec(p,i << 1);
      local_16 = false;
      if (iVar3 != 0) {
        iVar3 = Msat_HeapCheck_rec(p,i * 2 + 1);
        local_16 = iVar3 != 0;
      }
    }
    local_15 = local_16;
  }
  return (int)local_15;
}

Assistant:

int Msat_HeapCheck_rec( Msat_Order_t * p, int i )
{
    return i >= HSIZE(p) ||
        (
            ( HPARENT(i) == 0 || !HCOMPARE(p, HHEAP(p, i), HHEAP(p, HPARENT(i))) ) &&

            Msat_HeapCheck_rec( p, HLEFT(i) ) && 
            
            Msat_HeapCheck_rec( p, HRIGHT(i) )
        );
}